

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normal_matrix.cc
# Opt level: O3

void __thiscall
ipx::NormalMatrix::_Apply(NormalMatrix *this,Vector *rhs,Vector *lhs,double *rhs_dot_lhs)

{
  double dVar1;
  uint uVar2;
  int iVar3;
  Model *pMVar4;
  int *piVar5;
  pointer piVar6;
  pointer pdVar7;
  double *pdVar8;
  double *pdVar9;
  double *pdVar10;
  long lVar11;
  int iVar12;
  ulong uVar13;
  long lVar14;
  long lVar15;
  double dVar16;
  Timer timer;
  Timer local_38;
  
  pMVar4 = this->model_;
  uVar2 = pMVar4->num_rows_;
  iVar12 = pMVar4->num_cols_;
  lVar11 = (long)iVar12;
  piVar5 = (pMVar4->AI_).colptr_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar6 = (pMVar4->AI_).rowidx_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar7 = (pMVar4->AI_).values_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  Timer::Timer(&local_38);
  pdVar8 = this->W_;
  if (pdVar8 == (double *)0x0) {
    pdVar8 = lhs->_M_data;
    if (lhs->_M_size != 0) {
      memset(pdVar8,0,lhs->_M_size << 3);
    }
    if (0 < iVar12) {
      pdVar9 = rhs->_M_data;
      lVar14 = 0;
      iVar12 = *piVar5;
      do {
        iVar3 = piVar5[lVar14 + 1];
        if (iVar12 < iVar3) {
          lVar15 = (long)iVar12;
          dVar16 = 0.0;
          do {
            dVar16 = dVar16 + pdVar9[piVar6[lVar15]] * pdVar7[lVar15];
            lVar15 = lVar15 + 1;
          } while (iVar3 != lVar15);
          if (iVar12 < iVar3) {
            lVar15 = (long)iVar12;
            do {
              pdVar8[piVar6[lVar15]] = pdVar7[lVar15] * dVar16 + pdVar8[piVar6[lVar15]];
              lVar15 = lVar15 + 1;
            } while (iVar3 != lVar15);
          }
        }
        lVar14 = lVar14 + 1;
        iVar12 = iVar3;
      } while (lVar14 != lVar11);
    }
  }
  else {
    if (0 < (int)uVar2) {
      pdVar9 = rhs->_M_data;
      pdVar10 = lhs->_M_data;
      uVar13 = 0;
      do {
        pdVar10[uVar13] = pdVar9[uVar13] * pdVar8[lVar11 + uVar13];
        uVar13 = uVar13 + 1;
      } while (uVar2 != uVar13);
    }
    if (0 < iVar12) {
      pdVar9 = rhs->_M_data;
      pdVar10 = lhs->_M_data;
      lVar14 = 0;
      iVar12 = *piVar5;
      do {
        iVar3 = piVar5[lVar14 + 1];
        if (iVar12 < iVar3) {
          lVar15 = (long)iVar12;
          dVar16 = 0.0;
          do {
            dVar16 = dVar16 + pdVar9[piVar6[lVar15]] * pdVar7[lVar15];
            lVar15 = lVar15 + 1;
          } while (iVar3 != lVar15);
          if (iVar12 < iVar3) {
            dVar1 = pdVar8[lVar14];
            lVar15 = (long)iVar12;
            do {
              pdVar10[piVar6[lVar15]] = pdVar7[lVar15] * dVar16 * dVar1 + pdVar10[piVar6[lVar15]];
              lVar15 = lVar15 + 1;
            } while (iVar3 != lVar15);
          }
        }
        lVar14 = lVar14 + 1;
        iVar12 = iVar3;
      } while (lVar14 != lVar11);
    }
  }
  if (rhs_dot_lhs != (double *)0x0) {
    dVar16 = Dot(rhs,lhs);
    *rhs_dot_lhs = dVar16;
  }
  dVar16 = Timer::Elapsed(&local_38);
  this->time_ = dVar16 + this->time_;
  return;
}

Assistant:

void NormalMatrix::_Apply(const Vector& rhs, Vector& lhs,
                           double* rhs_dot_lhs) {
    const Int m = model_.rows();
    const Int n = model_.cols();
    const Int* Ap = model_.AI().colptr();
    const Int* Ai = model_.AI().rowidx();
    const double* Ax = model_.AI().values();
    #if MATVECMETHOD == 2
    const Int* Atp = model_.AIt().colptr();
    const Int* Ati = model_.AIt().rowidx();
    const double* Atx = model_.AIt().values();
    #endif
    Timer timer;

    assert(prepared_);
    assert((Int)lhs.size() == m);
    assert((Int)rhs.size() == m);

    if (W_) {
        #if MATVECMETHOD == 1
        for (Int i = 0; i < m; i++)
            lhs[i] = rhs[i] * W_[n+i];
        for (Int j = 0; j < n; j++) {
            Int begin = Ap[j], end = Ap[j+1];
            double d = 0.0;
            for (Int p = begin; p < end; p++)
                d += rhs[Ai[p]] * Ax[p];
            d *= W_[j];
            for (Int p = begin; p < end; p++)
                lhs[Ai[p]] += d * Ax[p];
        }
        #elif MATVECMETHOD == 2
        for (Int j = 0; j < n; j++) {
            Int begin = Ap[j], end = Ap[j+1];
            double d = 0.0;
            for (Int p = begin; p < end; p++)
                d += rhs[Ai[p]] * Ax[p];
            work_[j] = d * W_[j];
        }
        for (Int i = 0; i < m; i++)
            lhs[i] = rhs[i] * W_[n+i];
        for (Int i = 0; i < m; i++) {
            Int begin = Atp[i], end = Atp[i+1]-1; // skip identity entry
            double d = 0.0;
            for (Int p = begin; p < end; p++)
                d += work_[Ati[p]] * Atx[p];
            lhs[i] += d;
        }
        #elif MATVECMETHOD == 3
        for (Int j = 0; j < n; j++) {
            Int begin = Ap[j], end = Ap[j+1];
            double d = 0.0;
            for (Int p = begin; p < end; p++)
                d += rhs[Ai[p]] * Ax[p];
            work_[j] = d * W_[j];
        }
        for (Int i = 0; i < m; i++)
            lhs[i] = rhs[i] * W_[n+i];
        for (Int j = 0; j < n; j++) {
            Int begin = Ap[j], end = Ap[j+1];
            double d = work_[j];
            for (Int p = begin; p < end; p++)
                lhs[Ai[p]] += d * Ax[p];
        }
        #else
        #error "invalid MATHVECMETHOD"
        #endif
    } else {
        lhs = 0.0;
        for (Int j = 0; j < n; j++) {
            Int begin = Ap[j], end = Ap[j+1];
            double d = 0.0;
            for (Int p = begin; p < end; p++)
                d += rhs[Ai[p]] * Ax[p];
            for (Int p = begin; p < end; p++)
                lhs[Ai[p]] += d * Ax[p];
        }
    }
    if (rhs_dot_lhs)
        *rhs_dot_lhs = Dot(rhs,lhs);
    time_ += timer.Elapsed();
}